

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST_Parser.cpp
# Opt level: O3

shared_ptr<nigel::AstReturning> __thiscall
nigel::AST_Parser::splitMostRightExpr
          (AST_Parser *this,shared_ptr<nigel::AstExpr> *currLVal,
          shared_ptr<nigel::AstFunctionCall> *cExpr,int priority)

{
  Type TVar1;
  int iVar2;
  undefined8 uVar3;
  AST_Parser *pAVar4;
  mapped_type *pmVar5;
  undefined4 in_register_0000000c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  element_type *this_00;
  _func_int **pp_Var7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  int in_R8D;
  bool bVar8;
  shared_ptr<nigel::AstReturning> sVar9;
  undefined1 local_88 [36];
  key_type local_64;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  undefined8 *local_58;
  AST_Parser *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_48;
  _func_int **local_40;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  
  local_58 = (undefined8 *)CONCAT44(in_register_0000000c,priority);
  local_88._24_8_ = currLVal + 2;
  local_48 = &(cExpr->super___shared_ptr<nigel::AstFunctionCall,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount;
  pp_Var7 = (_func_int **)0x0;
  this_00 = (element_type *)0x0;
  local_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)currLVal;
  local_50 = this;
  do {
    TVar1 = (((cExpr->super___shared_ptr<nigel::AstFunctionCall,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
             )->super_AstReturning).super_AstExpr.type;
    if (TVar1 == term) {
      AstExpr::as<nigel::AstTerm>((AstExpr *)&local_40);
      pmVar5 = std::
               map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
               ::operator[]((map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                             *)local_88._24_8_,(key_type *)(local_40 + 0xb));
      if (in_R8D <= *pmVar5) goto LAB_00137eab;
      bVar8 = true;
LAB_00137f22:
      if (local_38 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
      }
      if (!bVar8) goto LAB_00137fb0;
    }
    else {
LAB_00137eab:
      local_64 = op_set;
      pmVar5 = std::
               map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
               ::operator[]((map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                             *)local_88._24_8_,&local_64);
      if (*pmVar5 != in_R8D) {
        if (TVar1 == term) {
          bVar8 = false;
          goto LAB_00137f22;
        }
LAB_00137fb0:
        if (pp_Var7 == (_func_int **)0x0) {
          ((__shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2> *)
          &local_60._M_pi[0xb]._vptr__Sp_counted_base)->_M_ptr = (element_type *)*local_58;
          this_01 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_60._M_pi[0xb]._M_use_count;
        }
        else {
          pp_Var7[9] = (_func_int *)*local_58;
          this_01 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(pp_Var7 + 10);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (this_01,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 1));
        pAVar4 = local_50;
        sVar9 = AstExpr::as<nigel::AstReturning>((AstExpr *)local_50);
        _Var6 = sVar9.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
        if (this_00 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
          _Var6._M_pi = extraout_RDX;
        }
        sVar9.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = _Var6._M_pi;
        sVar9.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)pAVar4;
        return (shared_ptr<nigel::AstReturning>)
               sVar9.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>;
      }
      AstExpr::as<nigel::AstTerm>((AstExpr *)local_88);
      pmVar5 = std::
               map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
               ::operator[]((map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                             *)local_88._24_8_,(key_type *)(local_88._0_8_ + 0x58));
      iVar2 = *pmVar5;
      bVar8 = iVar2 == in_R8D;
      if ((element_type *)local_88._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
      }
      if (TVar1 == term) goto LAB_00137f22;
      if (iVar2 != in_R8D) goto LAB_00137fb0;
    }
    AstExpr::as<nigel::AstTerm>((AstExpr *)local_88);
    uVar3 = local_88._8_8_;
    pp_Var7 = (_func_int **)local_88._0_8_;
    local_88._0_8_ = (_func_int **)0x0;
    local_88._8_8_ = (element_type *)0x0;
    if ((this_00 != (element_type *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00),
       (element_type *)local_88._8_8_ != (element_type *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
    }
    AstExpr::as<nigel::AstTerm>((AstExpr *)local_88);
    (cExpr->super___shared_ptr<nigel::AstFunctionCall,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         *(element_type **)(local_88._0_8_ + 0x48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (local_48,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88._0_8_ + 0x50));
    this_00 = (element_type *)uVar3;
    if ((element_type *)local_88._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
    }
  } while( true );
}

Assistant:

std::shared_ptr<AstReturning> AST_Parser::splitMostRightExpr( std::shared_ptr<AstExpr> currLVal, std::shared_ptr<AstFunctionCall> cExpr, int priority )
	{
		//Check if lValue is a term
		std::shared_ptr<AstTerm> clTerm = nullptr;
		while( ( currLVal->type == AstExpr::Type::term && opPriority[currLVal->as<AstTerm>()->op] < priority ) ||
			( priority == opPriority[TT::op_set] && opPriority[currLVal->as<AstTerm>()->op] == priority ) )
		{//Check if lTerm has to be splitted up
			clTerm = currLVal->as<AstTerm>();
			currLVal = currLVal->as<AstTerm>()->rVal;
		}

		//Test for lTerm
		if( clTerm != nullptr )
		{//Min. 1 term was splitted up
			clTerm->rVal = cExpr;
			return currLVal->as<AstReturning>();
		}
		else
		{//LValue is a atomic astExpr
			lValue = cExpr;//Set as lValue
			return currLVal->as<AstReturning>();
		}
	}